

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

string * __thiscall
branch_and_reduce_algorithm::debugString_abi_cxx11_
          (string *__return_storage_ptr__,branch_and_reduce_algorithm *this)

{
  bool bVar1;
  tm *__tp;
  size_t sVar2;
  ostream *poVar3;
  int local_23c;
  char local_238 [4];
  int i;
  char mbstr [100];
  time_t local_1c8;
  time_t t;
  locale local_1b0 [8];
  locale local_1a8 [8];
  stringstream local_1a0 [8];
  stringstream ins;
  ostream local_190 [376];
  branch_and_reduce_algorithm *local_18;
  branch_and_reduce_algorithm *this_local;
  
  local_18 = this;
  this_local = (branch_and_reduce_algorithm *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::locale::locale(local_1b0,"ja_JP.utf8");
  std::locale::global(local_1a8);
  std::locale::~locale(local_1a8);
  std::locale::~locale(local_1b0);
  local_1c8 = time((time_t *)0x0);
  __tp = localtime(&local_1c8);
  sVar2 = strftime(local_238,100,"%T",__tp);
  if (sVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,local_238);
    std::operator<<(poVar3,'\n');
  }
  local_23c = 0;
  while( true ) {
    bVar1 = false;
    if (local_23c < this->depth) {
      bVar1 = local_23c < this->maxDepth;
    }
    if (!bVar1) break;
    std::operator<<(local_190," ");
    local_23c = local_23c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string branch_and_reduce_algorithm::debugString() const
{
    stringstream ins;
#ifdef PUT_TIME
    time_t rawtime;
    struct tm *timeinfo;

    time(&rawtime);
    timeinfo = localtime(&rawtime);
    ins << std::put_time(timeinfo, "%T") << "  ";
#else
    std::locale::global(std::locale("ja_JP.utf8"));
    std::time_t t = std::time(NULL);
    char mbstr[100];
    if (std::strftime(mbstr, sizeof(mbstr), "%T", std::localtime(&t)))
    {
        std::cout << mbstr << '\n';
    }
#endif
    for (int i = 0; i < depth && i < maxDepth; ++i)
    {
        ins << " ";
    }
    return ins.str();
}